

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

int get_relative_dist(OrderHintInfo *oh,int a,int b)

{
  uint uVar1;
  int m;
  int diff;
  int bits;
  int b_local;
  int a_local;
  OrderHintInfo *oh_local;
  int local_4;
  
  if (oh->enable_order_hint == 0) {
    local_4 = 0;
  }
  else {
    uVar1 = 1 << ((byte)oh->order_hint_bits_minus_1 & 0x1f);
    local_4 = (a - b & uVar1 - 1) - (a - b & uVar1);
  }
  return local_4;
}

Assistant:

static inline int get_relative_dist(const OrderHintInfo *oh, int a, int b) {
  if (!oh->enable_order_hint) return 0;

  const int bits = oh->order_hint_bits_minus_1 + 1;

  assert(bits >= 1);
  assert(a >= 0 && a < (1 << bits));
  assert(b >= 0 && b < (1 << bits));

  int diff = a - b;
  const int m = 1 << (bits - 1);
  diff = (diff & (m - 1)) - (diff & m);
  return diff;
}